

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O3

int NULLCTypeInfo::IsArrayRef(NULLCRef r)

{
  uint in_stack_00000008;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0xaf,"int NULLCTypeInfo::IsArrayRef(NULLCRef)");
  }
  if (in_stack_00000008 < *(uint *)(linker + 0x20c)) {
    return (int)(*(int *)(*(long *)(linker + 0x200) + 0x10 + (ulong)in_stack_00000008 * 0x50) == 1);
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,
                "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

int IsArrayRef(NULLCRef r)
	{
		assert(linker);
		return linker->exTypes[r.typeID].subCat == ExternTypeInfo::CAT_ARRAY;
	}